

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O3

void __thiscall
QAnimationGroup::insertAnimation(QAnimationGroup *this,int index,QAbstractAnimation *animation)

{
  long *plVar1;
  P _b;
  QAnimationGroup *this_00;
  P _a;
  ulong i;
  long in_FS_OFFSET;
  QAbstractAnimation *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < index) {
    plVar1 = *(long **)(this + 8);
    i = (ulong)(uint)index;
    if (i <= (ulong)plVar1[0x16]) {
      this_00 = (QAnimationGroup *)QAbstractAnimation::group((QAbstractAnimation *)animation);
      if (this_00 != (QAnimationGroup *)0x0) {
        removeAnimation(this_00,animation);
        if ((ulong)plVar1[0x16] < i) {
          i = plVar1[0x16];
        }
      }
      local_38 = animation;
      QtPrivate::QPodArrayOps<QAbstractAnimation*>::emplace<QAbstractAnimation*&>
                ((QPodArrayOps<QAbstractAnimation*> *)(plVar1 + 0x14),i,&local_38);
      QList<QAbstractAnimation_*>::begin((QList<QAbstractAnimation_*> *)(plVar1 + 0x14));
      (animation->super_QObject).d_ptr.d[1].bindingStorage.bindingStatus = (QBindingStatus *)this;
      QObject::setParent(&animation->super_QObject,(QObject *)this);
      (**(code **)(*plVar1 + 0x20))(plVar1,i);
      goto LAB_003a7885;
    }
  }
  insertAnimation();
LAB_003a7885:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAnimationGroup::insertAnimation(int index, QAbstractAnimation *animation)
{
    Q_D(QAnimationGroup);

    if (index < 0 || index > d->animations.size()) {
        qWarning("QAnimationGroup::insertAnimation: index is out of bounds");
        return;
    }

    if (QAnimationGroup *oldGroup = animation->group()) {
        oldGroup->removeAnimation(animation);
        // ensure we don't insert out of bounds if oldGroup == this
        index = qMin(index, d->animations.size());
    }

    d->animations.insert(index, animation);
    QAbstractAnimationPrivate::get(animation)->group = this;
    // this will make sure that ChildAdded event is sent to 'this'
    animation->setParent(this);
    d->animationInsertedAt(index);
}